

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionManager.cpp
# Opt level: O2

void __thiscall SessionManager::~SessionManager(SessionManager *this)

{
  pointer ppSVar1;
  MutexFactory *this_00;
  vector<Session_*,_std::allocator<Session_*>_> toDelete;
  _Vector_base<Session_*,_std::allocator<Session_*>_> local_30;
  
  this->_vptr_SessionManager = (_func_int **)&PTR__SessionManager_0019ecd8;
  std::vector<Session_*,_std::allocator<Session_*>_>::vector
            ((vector<Session_*,_std::allocator<Session_*>_> *)&local_30,&this->sessions);
  ppSVar1 = (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppSVar1) {
    (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar1;
  }
  for (; local_30._M_impl.super__Vector_impl_data._M_start !=
         local_30._M_impl.super__Vector_impl_data._M_finish;
      local_30._M_impl.super__Vector_impl_data._M_start =
           local_30._M_impl.super__Vector_impl_data._M_start + 1) {
    if (*local_30._M_impl.super__Vector_impl_data._M_start != (Session *)0x0) {
      (*(*local_30._M_impl.super__Vector_impl_data._M_start)->_vptr_Session[1])();
    }
  }
  this_00 = MutexFactory::i();
  MutexFactory::recycleMutex(this_00,this->sessionsMutex);
  std::_Vector_base<Session_*,_std::allocator<Session_*>_>::~_Vector_base(&local_30);
  std::_Vector_base<Session_*,_std::allocator<Session_*>_>::~_Vector_base
            (&(this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>);
  return;
}

Assistant:

SessionManager::~SessionManager()
{
	std::vector<Session*> toDelete = sessions;
	sessions.clear();

	for (std::vector<Session*>::iterator i = toDelete.begin(); i != toDelete.end(); i++)
	{
		if (*i != NULL) delete *i;
	}

	MutexFactory::i()->recycleMutex(sessionsMutex);
}